

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterCompareInt
              (SortSubtask *pTask,int *pbKey2Cached,void *pKey1,int nKey1,void *pKey2,int nKey2)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  
  bVar3 = *(byte *)((long)pKey1 + 1);
  bVar4 = *(byte *)((long)pKey2 + 1);
  pbVar7 = (byte *)((ulong)*pKey1 + (long)pKey1);
  pbVar8 = (byte *)((ulong)*pKey2 + (long)pKey2);
  if (bVar3 == bVar4) {
    uVar10 = 0;
    do {
      if (""[(uint)bVar3] == uVar10) goto LAB_00151523;
      pbVar1 = pbVar7 + uVar10;
      pbVar2 = pbVar8 + uVar10;
      uVar10 = uVar10 + 1;
    } while ((uint)*pbVar1 - (uint)*pbVar2 == 0);
    iVar5 = (uint)*pbVar1 - (uint)*pbVar2;
    if ((char)(*pbVar8 ^ *pbVar7) < '\0') {
      iVar6 = (uint)(-1 < (char)*pbVar7) * 2 + -1;
      goto LAB_0015150b;
    }
  }
  else {
    iVar5 = (uint)bVar3 - (uint)bVar4;
    if (bVar3 < 8 || bVar4 < 8) {
      if (7 < bVar3) {
        iVar5 = -1;
      }
      iVar6 = 1;
      iVar9 = iVar5;
      if (7 < bVar4) {
        iVar9 = 1;
      }
      if (iVar9 < 1) {
        if ((char)*pbVar8 < '\0') goto LAB_0015150b;
      }
      else {
        iVar5 = -1;
        if (-1 < (char)*pbVar7) {
          iVar5 = iVar9;
        }
      }
    }
  }
  iVar6 = iVar5;
  if (iVar5 == 0) {
LAB_00151523:
    if (pTask->pSorter->pKeyInfo->nKeyField < 2) {
      return 0;
    }
    iVar5 = vdbeSorterCompareTail(pTask,pbKey2Cached,pKey1,nKey1,pKey2,nKey2);
    return iVar5;
  }
LAB_0015150b:
  iVar5 = -iVar6;
  if (*pTask->pSorter->pKeyInfo->aSortFlags == '\0') {
    iVar5 = iVar6;
  }
  return iVar5;
}

Assistant:

static int vdbeSorterCompareInt(
  SortSubtask *pTask,             /* Subtask context (for pKeyInfo) */
  int *pbKey2Cached,              /* True if pTask->pUnpacked is pKey2 */
  const void *pKey1, int nKey1,   /* Left side of comparison */
  const void *pKey2, int nKey2    /* Right side of comparison */
){
  const u8 * const p1 = (const u8 * const)pKey1;
  const u8 * const p2 = (const u8 * const)pKey2;
  const int s1 = p1[1];                 /* Left hand serial type */
  const int s2 = p2[1];                 /* Right hand serial type */
  const u8 * const v1 = &p1[ p1[0] ];   /* Pointer to value 1 */
  const u8 * const v2 = &p2[ p2[0] ];   /* Pointer to value 2 */
  int res;                              /* Return value */

  assert( (s1>0 && s1<7) || s1==8 || s1==9 );
  assert( (s2>0 && s2<7) || s2==8 || s2==9 );

  if( s1==s2 ){
    /* The two values have the same sign. Compare using memcmp(). */
    static const u8 aLen[] = {0, 1, 2, 3, 4, 6, 8, 0, 0, 0 };
    const u8 n = aLen[s1];
    int i;
    res = 0;
    for(i=0; i<n; i++){
      if( (res = v1[i] - v2[i])!=0 ){
        if( ((v1[0] ^ v2[0]) & 0x80)!=0 ){
          res = v1[0] & 0x80 ? -1 : +1;
        }
        break;
      }
    }
  }else if( s1>7 && s2>7 ){
    res = s1 - s2;
  }else{
    if( s2>7 ){
      res = +1;
    }else if( s1>7 ){
      res = -1;
    }else{
      res = s1 - s2;
    }
    assert( res!=0 );

    if( res>0 ){
      if( *v1 & 0x80 ) res = -1;
    }else{
      if( *v2 & 0x80 ) res = +1;
    }
  }

  if( res==0 ){
    if( pTask->pSorter->pKeyInfo->nKeyField>1 ){
      res = vdbeSorterCompareTail(
          pTask, pbKey2Cached, pKey1, nKey1, pKey2, nKey2
      );
    }
  }else if( pTask->pSorter->pKeyInfo->aSortFlags[0] ){
    assert( !(pTask->pSorter->pKeyInfo->aSortFlags[0]&KEYINFO_ORDER_BIGNULL) );
    res = res * -1;
  }

  return res;
}